

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O3

void av1_combine_interintra
               (MACROBLOCKD *xd,BLOCK_SIZE bsize,int plane,uint8_t *inter_pred,int inter_stride,
               uint8_t *intra_pred,int intra_stride)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  INTERINTRA_MODE IVar3;
  byte bVar4;
  uint32_t uVar5;
  int iVar6;
  MB_MODE_INFO *pMVar7;
  uint8_t *puVar8;
  uint uVar9;
  int iVar10;
  undefined7 in_register_00000031;
  uint8_t *puVar11;
  ulong uVar12;
  uint8_t *puVar13;
  ulong uVar14;
  uint uVar15;
  ulong __n;
  bool bVar16;
  bool bVar17;
  uint8_t (*pauVar18) [1024];
  byte bVar19;
  uint8_t local_4038 [16392];
  
  uVar12 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  BVar1 = av1_ss_size_lookup[uVar12][xd->plane[plane].subsampling_x][xd->plane[plane].subsampling_y]
  ;
  pMVar7 = *xd->mi;
  puVar8 = xd->plane[plane].dst.buf;
  uVar5 = xd->plane[plane].dst.stride;
  iVar10 = (int)CONCAT71(in_register_00000031,bsize);
  if ((xd->cur_buf->flags & 8) == 0) {
    bVar2 = block_size_wide[BVar1];
    if ((*(ushort *)&pMVar7->field_0xa7 >> 10 & 1) == 0) {
      pauVar18 = smooth_interintra_mask_buf[pMVar7->interintra_mode] + BVar1;
      bVar17 = false;
      bVar16 = false;
      bVar19 = bVar2;
    }
    else {
      if (*(int *)((long)&av1_wedge_params_lookup[0].wedge_types + (ulong)(uint)(iVar10 << 5)) < 1)
      {
        return;
      }
      bVar16 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [uVar12] * 2 == (uint)bVar2;
      bVar17 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [uVar12] * 2 == (uint)block_size_high[BVar1];
      bVar19 = block_size_wide[uVar12];
      pauVar18 = *(uint8_t (**) [1024])
                  (*(long *)((long)&av1_wedge_params_lookup[0].masks + (ulong)(uint)(iVar10 << 5)) +
                  (long)pMVar7->interintra_wedge_index * 8);
    }
    (*aom_blend_a64_mask)
              (puVar8,uVar5,intra_pred,intra_stride,inter_pred,inter_stride,*pauVar18,
               (uint32_t)bVar19,(int)bVar2,(int)block_size_high[BVar1],SUB14(bVar16,0),
               SUB14(bVar17,0));
  }
  else {
    iVar6 = xd->bd;
    bVar2 = block_size_wide[BVar1];
    __n = (ulong)bVar2;
    bVar19 = block_size_high[BVar1];
    uVar15 = (uint)bVar2;
    uVar9 = (uint)bVar19;
    if ((*(ushort *)&pMVar7->field_0xa7 >> 10 & 1) == 0) {
      IVar3 = pMVar7->interintra_mode;
      bVar4 = " \x10\x10\x10\b\b\b\x04\x04\x04\x02\x02\x02\x01\x01\x01\b\b\x04\x04\x02\x02"[BVar1];
      if (IVar3 == '\x01') {
        uVar12 = (ulong)((uint)bVar19 + (uint)(uVar9 == 0));
        puVar11 = local_4038;
        puVar13 = 
        "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
        ;
        do {
          memset(puVar11,(uint)*puVar13,__n);
          puVar11 = puVar11 + __n;
          puVar13 = puVar13 + bVar4;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      else if (IVar3 == '\x02') {
        iVar10 = 0;
        puVar11 = local_4038;
        do {
          puVar13 = 
          "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          ;
          uVar12 = 0;
          do {
            puVar11[uVar12] = *puVar13;
            uVar12 = uVar12 + 1;
            puVar13 = puVar13 + bVar4;
          } while ((uint)bVar2 + (uint)(uVar15 == 0) != uVar12);
          puVar11 = puVar11 + __n;
          iVar10 = iVar10 + 1;
        } while (iVar10 != (uint)bVar19 + (uint)(uVar9 == 0));
      }
      else if (IVar3 == '\x03') {
        uVar9 = 0;
        puVar11 = local_4038;
        do {
          uVar12 = 0;
          do {
            uVar14 = uVar12 & 0xffffffff;
            if (uVar9 < (uint)uVar12) {
              uVar14 = (ulong)uVar9;
            }
            puVar11[uVar12] =
                 "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                 [uVar14 * bVar4];
            uVar12 = uVar12 + 1;
          } while ((uint)bVar2 + (uint)(uVar15 == 0) != uVar12);
          puVar11 = puVar11 + __n;
          uVar9 = uVar9 + 1;
        } while (uVar9 != (uint)bVar19 + (uint)(bVar19 == 0));
      }
      else {
        memset(local_4038,0x20,((uint)bVar19 + (uint)(bVar19 == 0) & 0xff) * __n);
      }
      (*aom_highbd_blend_a64_mask)
                (puVar8,uVar5,intra_pred,intra_stride,inter_pred,inter_stride,local_4038,(uint)bVar2
                 ,(uint)bVar2,(int)bVar19,0,0,iVar6);
    }
    else if (0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types + (ulong)(uint)(iVar10 << 5)
                         )) {
      (*aom_highbd_blend_a64_mask)
                (puVar8,uVar5,intra_pred,intra_stride,inter_pred,inter_stride,
                 *(uint8_t **)
                  (*(long *)((long)&av1_wedge_params_lookup[0].masks + (ulong)(uint)(iVar10 << 5)) +
                  (long)pMVar7->interintra_wedge_index * 8),(uint32_t)block_size_wide[uVar12],
                 (uint)bVar2,(int)bVar19,
                 SUB14((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [uVar12] * 2 == uVar15,0),
                 SUB14((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [uVar12] * 2 == uVar9,0),iVar6);
    }
  }
  return;
}

Assistant:

void av1_combine_interintra(MACROBLOCKD *xd, BLOCK_SIZE bsize, int plane,
                            const uint8_t *inter_pred, int inter_stride,
                            const uint8_t *intra_pred, int intra_stride) {
  const int ssx = xd->plane[plane].subsampling_x;
  const int ssy = xd->plane[plane].subsampling_y;
  const BLOCK_SIZE plane_bsize = get_plane_block_size(bsize, ssx, ssy);
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    combine_interintra_highbd(
        xd->mi[0]->interintra_mode, xd->mi[0]->use_wedge_interintra,
        xd->mi[0]->interintra_wedge_index, INTERINTRA_WEDGE_SIGN, bsize,
        plane_bsize, xd->plane[plane].dst.buf, xd->plane[plane].dst.stride,
        inter_pred, inter_stride, intra_pred, intra_stride, xd->bd);
    return;
  }
#endif
  combine_interintra(
      xd->mi[0]->interintra_mode, xd->mi[0]->use_wedge_interintra,
      xd->mi[0]->interintra_wedge_index, INTERINTRA_WEDGE_SIGN, bsize,
      plane_bsize, xd->plane[plane].dst.buf, xd->plane[plane].dst.stride,
      inter_pred, inter_stride, intra_pred, intra_stride);
}